

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O0

void Eigen::internal::
     nnls_householder_qr_inplace_update<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::Matrix<float,_1,1,0,_1,1>,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>>
               (Matrix<float,__1,__1,_0,__1,__1> *mat,Matrix<float,__1,_1,_0,__1,_1> *hCoeffs,
               Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *newColumn,Index k,
               Scalar *tempData)

{
  Index IVar1;
  Index IVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  ColXpr local_288;
  Type local_250;
  Scalar local_1e4;
  undefined1 local_1e0 [4];
  RealScalar beta;
  Type local_1a8;
  ColXpr local_140;
  Type local_108;
  long local_a0;
  Index remainingRows;
  Index i;
  undefined1 local_48 [8];
  Matrix<float,__1,_1,_0,__1,_1> tempVector;
  Index rows;
  Scalar *tempData_local;
  Index k_local;
  Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *newColumn_local;
  Matrix<float,__1,_1,_0,__1,_1> *hCoeffs_local;
  Matrix<float,__1,__1,_0,__1,__1> *mat_local;
  
  tempVector.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::rows
                 (&mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  IVar1 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  if (IVar1 <= k) {
    __assert_fail("k < mat.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x102,
                  "void Eigen::internal::nnls_householder_qr_inplace_update(MatrixQR &, HCoeffs &, const VectorQR &, typename MatrixQR::Index, typename MatrixQR::Scalar *) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, VectorQR = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
                 );
  }
  if (tempVector.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows <= k
     ) {
    __assert_fail("k < rows",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x103,
                  "void Eigen::internal::nnls_householder_qr_inplace_update(MatrixQR &, HCoeffs &, const VectorQR &, typename MatrixQR::Index, typename MatrixQR::Scalar *) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, VectorQR = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
                 );
  }
  IVar2 = EigenBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::size
                    ((EigenBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)hCoeffs);
  IVar1 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                    (&mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
  if (IVar2 != IVar1) {
    __assert_fail("hCoeffs.size() == mat.cols()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                  ,0x104,
                  "void Eigen::internal::nnls_householder_qr_inplace_update(MatrixQR &, HCoeffs &, const VectorQR &, typename MatrixQR::Index, typename MatrixQR::Scalar *) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, VectorQR = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
                 );
  }
  IVar2 = EigenBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::size
                    ((EigenBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                      *)newColumn);
  if (IVar2 == tempVector.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows) {
    Matrix<float,_-1,_1,_0,_-1,_1>::Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_48);
    rows = (Index)tempData;
    if (tempData == (Scalar *)0x0) {
      IVar1 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                        (&mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
      PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_48,IVar1);
      rows = (Index)PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::data
                              ((PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)local_48);
    }
    DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::col
              ((ColXpr *)&i,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)mat,k);
    Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::operator=
              ((Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true> *)&i,newColumn);
    for (remainingRows = 0; remainingRows < k; remainingRows = remainingRows + 1) {
      local_a0 = tempVector.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows - remainingRows;
      DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::col
                (&local_140,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)mat,k);
      DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                (&local_108,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 &local_140,local_a0);
      DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::col
                ((ColXpr *)local_1e0,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)mat,
                 remainingRows);
      DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
                (&local_1a8,
                 (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                 local_1e0,local_a0 + -1);
      pSVar3 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::coeffRef
                         (&hCoeffs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,
                          remainingRows);
      MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,1,true>,-1,1,false>>
      ::
      applyHouseholderOnTheLeft<Eigen::VectorBlock<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1>>
                ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>>
                  *)&local_108,&local_1a8,pSVar3,(Scalar *)(rows + 4 + remainingRows * 4));
    }
    DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::col
              (&local_288,(DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)mat,k);
    DenseBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::tail<long>
              (&local_250,
               (DenseBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
               &local_288,
               tempVector.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows - k);
    pSVar3 = PlainObjectBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::coeffRef
                       (&hCoeffs->super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,k);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_false>_>
    ::makeHouseholderInPlace
              ((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>_>
                *)&local_250,pSVar3,&local_1e4);
    pSVar4 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::coeffRef
                       (&mat->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,k,k);
    *pSVar4 = local_1e4;
    Matrix<float,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<float,__1,_1,_0,__1,_1> *)local_48);
    return;
  }
  __assert_fail("newColumn.size() == rows",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen3-nnls/src/nnls.h"
                ,0x105,
                "void Eigen::internal::nnls_householder_qr_inplace_update(MatrixQR &, HCoeffs &, const VectorQR &, typename MatrixQR::Index, typename MatrixQR::Scalar *) [MatrixQR = Eigen::Matrix<float, -1, -1>, HCoeffs = Eigen::Matrix<float, -1, 1>, VectorQR = Eigen::Block<Eigen::Matrix<float, -1, -1>, -1, 1, true>]"
               );
}

Assistant:

void nnls_householder_qr_inplace_update(MatrixQR& mat, HCoeffs &hCoeffs,
                                        const VectorQR &newColumn,
                                        typename MatrixQR::Index k,
                                        typename MatrixQR::Scalar* tempData = 0)
{
  typedef typename MatrixQR::Index Index;
  typedef typename MatrixQR::Scalar Scalar;
  typedef typename MatrixQR::RealScalar RealScalar;
  Index rows = mat.rows();

  eigen_assert(k < mat.cols());
  eigen_assert(k < rows);
  eigen_assert(hCoeffs.size() == mat.cols());
  eigen_assert(newColumn.size() == rows);

  Matrix<Scalar,Dynamic,1,ColMajor,MatrixQR::MaxColsAtCompileTime,1> tempVector;
  if(tempData == 0) {
    tempVector.resize(mat.cols());
    tempData = tempVector.data();
  }

  // Store new column in mat at column k
  mat.col(k) = newColumn;
  // Apply H = H_1...H_{k-1} on newColumn (skip if k=0)
  for (Index i=0; i<k; ++i) {
    Index remainingRows = rows - i;
    mat.col(k).tail(remainingRows).applyHouseholderOnTheLeft(
          mat.col(i).tail(remainingRows-1), hCoeffs.coeffRef(i), tempData+i+1);
  }
  // Construct Householder projector in-place in column k
  RealScalar beta;
  mat.col(k).tail(rows-k).makeHouseholderInPlace(hCoeffs.coeffRef(k), beta);
  mat.coeffRef(k,k) = beta;
}